

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O2

float compute_error_of_weight_set_1plane
                (endpoints_and_weights *eai,decimation_info *di,float *dec_weight_quant_uvalue)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint i_2;
  uint i;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  float fVar12;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  uVar6 = (ulong)di->texel_count;
  if (uVar6 == 0) {
    __assert_fail("texel_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x2b7,
                  "float compute_error_of_weight_set_1plane(const endpoints_and_weights &, const decimation_info &, const float *)"
                 );
  }
  auVar17 = ZEXT1664(ZEXT816(0) << 0x40);
  if (di->max_texel_weight_count < 3) {
    if (di->max_texel_weight_count == 2) {
      uVar5 = 0;
      while( true ) {
        auVar16 = auVar17._0_16_;
        auVar9 = in_ZMM0._0_32_;
        if (uVar6 <= uVar5) break;
        bilinear_infill_vla_2(di,dec_weight_quant_uvalue,(uint)uVar5);
        auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [32])(eai->weights + uVar5));
        pfVar1 = eai->weight_error_scale + uVar5;
        fVar7 = auVar9._0_4_ * auVar9._0_4_ * *pfVar1;
        fVar10 = auVar9._4_4_ * auVar9._4_4_ * pfVar1[1];
        auVar4._4_4_ = fVar10;
        auVar4._0_4_ = fVar7;
        fVar11 = auVar9._8_4_ * auVar9._8_4_ * pfVar1[2];
        auVar4._8_4_ = fVar11;
        fVar12 = auVar9._12_4_ * auVar9._12_4_ * pfVar1[3];
        auVar4._12_4_ = fVar12;
        fVar13 = auVar9._16_4_ * auVar9._16_4_ * pfVar1[4];
        auVar4._16_4_ = fVar13;
        fVar14 = auVar9._20_4_ * auVar9._20_4_ * pfVar1[5];
        auVar4._20_4_ = fVar14;
        fVar15 = auVar9._24_4_ * auVar9._24_4_ * pfVar1[6];
        auVar4._24_4_ = fVar15;
        auVar4._28_4_ = auVar9._28_4_;
        local_38 = auVar17._0_4_;
        fStack_34 = auVar17._4_4_;
        fStack_30 = auVar17._8_4_;
        fStack_2c = auVar17._12_4_;
        in_ZMM0 = ZEXT1664(auVar4._16_16_);
        auVar17 = ZEXT1664(CONCAT412(auVar9._28_4_ + fVar12 + fStack_2c,
                                     CONCAT48(fVar15 + fVar11 + fStack_30,
                                              CONCAT44(fVar14 + fVar10 + fStack_34,
                                                       fVar13 + fVar7 + local_38))));
        uVar5 = uVar5 + 8;
      }
    }
    else {
      for (uVar5 = 0; auVar16 = auVar17._0_16_, uVar5 < uVar6; uVar5 = uVar5 + 8) {
        auVar9 = vsubps_avx(*(undefined1 (*) [32])(dec_weight_quant_uvalue + uVar5),
                            *(undefined1 (*) [32])(eai->weights + uVar5));
        pfVar1 = eai->weight_error_scale + uVar5;
        fVar7 = auVar9._4_4_ * auVar9._4_4_ * pfVar1[1];
        auVar17 = ZEXT1664(CONCAT412(auVar9._28_4_ +
                                     auVar17._12_4_ + auVar9._12_4_ * auVar9._12_4_ * pfVar1[3],
                                     CONCAT48(auVar9._24_4_ * auVar9._24_4_ * pfVar1[6] +
                                              auVar17._8_4_ +
                                              auVar9._8_4_ * auVar9._8_4_ * pfVar1[2],
                                              CONCAT44(fVar7 + auVar17._4_4_ + fVar7,
                                                       auVar9._16_4_ * auVar9._16_4_ * pfVar1[4] +
                                                       auVar17._0_4_ +
                                                       auVar9._0_4_ * auVar9._0_4_ * *pfVar1))));
      }
    }
  }
  else {
    uVar5 = 0;
    while( true ) {
      auVar16 = auVar17._0_16_;
      auVar9 = in_ZMM0._0_32_;
      if (uVar6 <= uVar5) break;
      bilinear_infill_vla(di,dec_weight_quant_uvalue,(uint)uVar5);
      auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [32])(eai->weights + uVar5));
      pfVar1 = eai->weight_error_scale + uVar5;
      fVar7 = auVar9._0_4_ * auVar9._0_4_ * *pfVar1;
      fVar10 = auVar9._4_4_ * auVar9._4_4_ * pfVar1[1];
      auVar3._4_4_ = fVar10;
      auVar3._0_4_ = fVar7;
      fVar11 = auVar9._8_4_ * auVar9._8_4_ * pfVar1[2];
      auVar3._8_4_ = fVar11;
      fVar12 = auVar9._12_4_ * auVar9._12_4_ * pfVar1[3];
      auVar3._12_4_ = fVar12;
      fVar13 = auVar9._16_4_ * auVar9._16_4_ * pfVar1[4];
      auVar3._16_4_ = fVar13;
      fVar14 = auVar9._20_4_ * auVar9._20_4_ * pfVar1[5];
      auVar3._20_4_ = fVar14;
      fVar15 = auVar9._24_4_ * auVar9._24_4_ * pfVar1[6];
      auVar3._24_4_ = fVar15;
      auVar3._28_4_ = auVar9._28_4_;
      local_38 = auVar17._0_4_;
      fStack_34 = auVar17._4_4_;
      fStack_30 = auVar17._8_4_;
      fStack_2c = auVar17._12_4_;
      in_ZMM0 = ZEXT1664(auVar3._16_16_);
      auVar17 = ZEXT1664(CONCAT412(auVar9._28_4_ + fVar12 + fStack_2c,
                                   CONCAT48(fVar15 + fVar11 + fStack_30,
                                            CONCAT44(fVar14 + fVar10 + fStack_34,
                                                     fVar13 + fVar7 + local_38))));
      uVar5 = uVar5 + 8;
    }
  }
  auVar2 = vshufpd_avx(auVar16,auVar16,1);
  auVar8._0_4_ = auVar16._0_4_ + auVar2._0_4_;
  auVar8._4_4_ = auVar16._4_4_ + auVar2._4_4_;
  auVar8._8_4_ = auVar16._8_4_ + auVar2._8_4_;
  auVar8._12_4_ = auVar16._12_4_ + auVar2._12_4_;
  auVar16 = vhaddps_avx(auVar8,auVar8);
  return auVar16._0_4_;
}

Assistant:

float compute_error_of_weight_set_1plane(
	const endpoints_and_weights& eai,
	const decimation_info& di,
	const float* dec_weight_quant_uvalue
) {
	vfloatacc error_summav = vfloatacc::zero();
	unsigned int texel_count = di.texel_count;
	promise(texel_count > 0);

	// Process SIMD-width chunks, safe to over-fetch - the extra space is zero initialized
	if (di.max_texel_weight_count > 2)
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values = bilinear_infill_vla(di, dec_weight_quant_uvalue, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values = loada(eai.weights + i);
			vfloat diff = current_values - actual_values;
			vfloat significance = loada(eai.weight_error_scale + i);
			vfloat error = diff * diff * significance;

			haccumulate(error_summav, error);
		}
	}
	else if (di.max_texel_weight_count > 1)
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values = bilinear_infill_vla_2(di, dec_weight_quant_uvalue, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values = loada(eai.weights + i);
			vfloat diff = current_values - actual_values;
			vfloat significance = loada(eai.weight_error_scale + i);
			vfloat error = diff * diff * significance;

			haccumulate(error_summav, error);
		}
	}
	else
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Load the weight set directly, without interpolation
			vfloat current_values = loada(dec_weight_quant_uvalue + i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values = loada(eai.weights + i);
			vfloat diff = current_values - actual_values;
			vfloat significance = loada(eai.weight_error_scale + i);
			vfloat error = diff * diff * significance;

			haccumulate(error_summav, error);
		}
	}

	// Resolve the final scalar accumulator sum
	return hadd_s(error_summav);
}